

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O0

void __thiscall minihttp::Request::Request(Request *this,string *h,string *res,int p,void *u)

{
  void *u_local;
  int p_local;
  string *res_local;
  string *h_local;
  Request *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->host,(string *)h);
  std::__cxx11::string::string((string *)&this->header);
  std::__cxx11::string::string((string *)&this->resource,(string *)res);
  std::__cxx11::string::string((string *)&this->extraGetHeaders);
  this->port = 0x50;
  this->user = u;
  this->useSSL = false;
  POST::POST(&this->post);
  return;
}

Assistant:

Request(const std::string& h, const std::string& res, int p = 80, void *u = NULL)
        : host(h), resource(res), port(80), user(u), useSSL(false) {}